

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

double log(double __x)

{
  char in_AL;
  uint uVar1;
  long lVar2;
  char *in_RSI;
  byte in_DIL;
  double extraout_XMM0_Qa;
  va_list args;
  undefined1 local_c8 [48];
  double local_98;
  
  if (in_AL != '\0') {
    local_98 = __x;
  }
  if (((afl_debug_enabled != 0) || ((afl_debug_unicorn_enabled & 1) != 0)) &&
     ((byte)((afl_debug_enabled | in_DIL) & (in_DIL ^ 1 | afl_debug_unicorn_enabled)) == 1)) {
    fwrite("[u] ",4,1,_stderr);
    if (afl_debug_enabled == 1) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      fprintf(_stderr,"[%04.6f] ",(double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
    }
    if ((in_DIL != 0) && (afl_debug_unicorn_enabled == 1)) {
      uVar1 = getpid();
      fprintf(_stderr,"[%04d] ",(ulong)uVar1);
    }
    args[0].reg_save_area = local_c8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    vfprintf(_stderr,in_RSI,args);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

static void log(bool in_child, const char* fmt, ...) {
    va_list args;

    if (likely(!afl_debug_enabled && !afl_debug_unicorn_enabled)) {
        return;
    }

    if (in_child && !afl_debug_unicorn_enabled) {
        return;
    }

    if (!in_child && !afl_debug_enabled) {
        return;
    }

    fprintf(stderr, "[u] ");

    if (afl_debug_enabled) {
        auto n = std::chrono::steady_clock::now();

        fprintf(
            stderr, "[%04.6f] ",
            std::chrono::duration_cast<std::chrono::duration<double>>(n - t0)
                .count());
    }

    if (in_child && afl_debug_unicorn_enabled) {
        pid_t p = getpid();

        fprintf(stderr, "[%04" PRId32 "] ", p);
    }

    va_start(args, fmt);

    vfprintf(stderr, fmt, args);

    va_end(args);
}